

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<int,false>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  SparseArraySegmentBase **ppSVar8;
  Var pvVar9;
  uint local_34;
  int compare;
  uint i;
  int currentRes;
  uint headSegLen;
  SparseArraySegment<int> *headSegment;
  uint len;
  bool findMax_local;
  ScriptContext *scriptContext_local;
  JavascriptNativeArray *this_local;
  
  bVar4 = Js::JavascriptArray::HasNoMissingValues(&this->super_JavascriptArray);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  pSVar7 = Js::JavascriptArray::GetHead(&this->super_JavascriptArray);
  uVar1 = pSVar7->length;
  if (uVar1 != uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar7->next);
  if (*ppSVar8 != (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa2b,"(false)",
                                "FindMinOrMax currently supports native arrays with only one segment"
                               );
    if (bVar4) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      Throw::FatalInternalError(-0x7fffbffb);
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  compare = pSVar7[1].left;
  local_34 = 0;
  do {
    if (uVar1 <= local_34) {
      pvVar9 = JavascriptNumber::ToVarNoCheck((double)compare,scriptContext);
      return pvVar9;
    }
    TVar2 = (&pSVar7[1].left)[local_34];
    if (findMax) {
      if (compare < (int)TVar2) {
LAB_010ea523:
        compare = TVar2;
      }
    }
    else if ((int)TVar2 < compare) goto LAB_010ea523;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }